

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_push_stack(Integer datatype,Integer nelem,char *name,Integer *memhandle)

{
  AD *ad_00;
  ulongi uVar1;
  Integer IVar2;
  Integer *in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  Pointer new_sp;
  ulongi nbytes;
  Pointer client_space;
  AD *ad;
  AR ar;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  AD *pAVar3;
  ErrorType in_stack_ffffffffffffffb0;
  ErrorLevel in_stack_ffffffffffffffb4;
  TableData in_stack_ffffffffffffffb8;
  AR local_38;
  Integer *local_28;
  undefined8 local_20;
  ulong local_18;
  long local_10;
  Boolean local_8;
  
  ma_stats.calls[0x17] = ma_stats.calls[0x17] + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (ma_trace != 0) {
    printf("MA: pushing \'%s\' (%d)\n",in_RDX,in_RSI & 0xffffffff);
  }
  if (ma_initialized == 0) {
    sprintf(ma_ebuf,"block \'%s\', MA not yet initialized",local_20);
    ma_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
    local_8 = 0;
  }
  else if ((local_10 < 1000) || (0x3f8 < local_10)) {
    sprintf(ma_ebuf,"block \'%s\', invalid datatype: %ld",local_20,local_10);
    ma_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
    local_8 = 0;
  }
  else if ((long)local_18 < 0) {
    sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",local_20,local_18);
    ma_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
    local_8 = 0;
  }
  else {
    local_38.datatype = local_10 + -1000;
    local_38.nelem = local_18;
    local_10 = local_38.datatype;
    balloc_before(&local_38,ma_sp,(Pointer *)&stack0xffffffffffffffb8,
                  (ulongi *)&stack0xffffffffffffffb0);
    ad_00 = (AD *)(ma_sp + -CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if ((ulong)((long)ma_sp - (long)ma_hp) <
        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)) {
      sprintf(ma_ebuf,"block \'%s\', not enough space to allocate %lu bytes",local_20,
              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      ma_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,(char *)ad_00,
               in_stack_ffffffffffffffa0);
      local_8 = 0;
    }
    else {
      ad_00->datatype = local_10;
      ad_00->nelem = local_18;
      pAVar3 = ad_00;
      str_ncopy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
      ad_00->client_space = in_stack_ffffffffffffffb8;
      ad_00->nbytes = CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      list_insert(ad_00,&ma_sused);
      uVar1 = checksum(ad_00);
      ad_00->checksum = uVar1;
      guard_set(ad_00);
      ma_sp = (Pointer)pAVar3;
      ma_stats.sblocks = ma_stats.sblocks + 1;
      uVar1 = ma_stats.sblocks;
      if (ma_stats.sblocks < ma_stats.sblocks_max) {
        uVar1 = ma_stats.sblocks_max;
      }
      ma_stats.sblocks_max = uVar1;
      ma_stats.sbytes = ad_00->nbytes + ma_stats.sbytes;
      uVar1 = ma_stats.sbytes;
      if (ma_stats.sbytes < ma_stats.sbytes_max) {
        uVar1 = ma_stats.sbytes_max;
      }
      ma_stats.sbytes_max = uVar1;
      IVar2 = ma_table_allocate(in_stack_ffffffffffffffb8);
      *local_28 = IVar2;
      if (IVar2 == -1) {
        local_8 = 0;
      }
      else {
        local_8 = 1;
      }
    }
  }
  return local_8;
}

Assistant:

public Boolean MA_push_stack(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle     /* RETURN: handle for this block */)
{
    AR        ar;        /* allocation request */
    AD        *ad;        /* AD for newly allocated block */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */
    Pointer    new_sp;        /* new ma_sp */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_push_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    if (ma_trace) 
    (void)printf("MA: pushing '%s' (%d)\n", name, (int)nelem);

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', MA not yet initialized",
            name);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid datatype: %ld",
            name, (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * attempt to allocate space
     */

    ar.datatype = datatype;
    ar.nelem = nelem;

    balloc_before(&ar, ma_sp, &client_space, &nbytes);

    new_sp = ma_sp - nbytes;
    /* if (new_sp < ma_hp) */
    if (((ulongi)(ma_sp - ma_hp)) < nbytes)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', not enough space to allocate %lu bytes",
            name, nbytes);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }
    else
    {
        ad = (AD *)new_sp;
    }

    /*
     * space has been allocated
     */

    /* initialize the AD */
    ad->datatype = datatype;
    ad->nelem = nelem;
    str_ncopy(ad->name, (char*)name, MA_NAMESIZE);
    ad->client_space = client_space;
    ad->nbytes = nbytes;
    list_insert(ad, &ma_sused);
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* update ma_sp */
    ma_sp = new_sp;

#ifdef STATS
    ma_stats.sblocks++;
    ma_stats.sblocks_max = max(ma_stats.sblocks, ma_stats.sblocks_max);
    ma_stats.sbytes += ad->nbytes;
    ma_stats.sbytes_max = max(ma_stats.sbytes, ma_stats.sbytes_max);
#endif /* STATS */

    /* convert AD to memhandle */
    if ((*memhandle = ma_table_allocate((TableData)ad)) == TABLE_HANDLE_NONE)
        /* failure */
        return MA_FALSE;
    else
        /* success */
        return MA_TRUE;
}